

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O3

int main(int argc,char **argv)

{
  _union_1457 _Var1;
  ulong uVar2;
  int iVar3;
  __pid_t __pid;
  uint uVar4;
  __pid_t _Var5;
  int iVar6;
  int *piVar7;
  size_t sVar8;
  FILE *pFVar9;
  char **ppcVar10;
  char *pcVar11;
  char *pcVar12;
  uint testIdx;
  ulong uVar13;
  uint uVar14;
  TLabTest TVar15;
  timeval tv;
  rusage rusage;
  uint local_21c;
  char **local_218;
  ulong local_210;
  char *local_208;
  timespec local_200;
  _union_1457 local_1f0;
  sigset_t local_1e8;
  undefined4 local_168;
  rusage local_158;
  sigaction local_c8;
  
  local_208 = *argv;
  if (argc < 3) {
    PrintWithoutBuffering("\nKOI FIT NSU Lab Tester (c) 2009-2020 by Evgueni Petrov\n");
    if (argc != 2) {
      pcVar11 = "\nTo test mylab.exe, do %s mylab.exe\n";
      pcVar12 = local_208;
      goto LAB_00102b49;
    }
  }
  else {
    pcVar12 = argv[1];
    if (((*pcVar12 == '-') && (pcVar12[1] == 'a')) && (pcVar12[2] == '\0')) {
      argv = argv + 1;
      UserTestAll = '\x01';
      argc = argc - 1;
    }
    ppcVar10 = argv;
    if ((uint)argc < 4) {
LAB_00102822:
      argv = ppcVar10;
      if ((2 < (uint)argc) && (pcVar12 = ppcVar10[1], *pcVar12 == '-')) {
LAB_00102839:
        argv = ppcVar10;
        if ((pcVar12[1] == 'e') && (pcVar12[2] == '\0')) {
          pcVar12 = ppcVar10[2];
          memset(&local_1e8,0,0x90);
          local_1f0.sa_handler = SigchldTrap;
          sigemptyset(&local_1e8);
          local_168 = 1;
          iVar3 = sigaction(0x11,(sigaction *)&local_1f0,&local_c8);
          if (iVar3 != 0) goto LAB_00102bee;
          fflush(_stdout);
          iVar3 = access(".",7);
          if (iVar3 == -1) {
            pcVar12 = "access";
LAB_00102bc8:
            ReportSystemError(pcVar12);
LAB_00102bcd:
            iVar3 = 1;
          }
          else {
            __pid = fork();
            if (__pid == -1) {
              pcVar12 = "fork";
              goto LAB_00102bc8;
            }
            if (__pid == 0) {
              pFVar9 = freopen("in.txt","r",_stdin);
              if ((pFVar9 == (FILE *)0x0) ||
                 (pFVar9 = freopen("out.txt","w",_stdout), pFVar9 == (FILE *)0x0)) {
                pcVar12 = "freopen";
              }
              else {
                iVar3 = execl(pcVar12,pcVar12,0);
                if (iVar3 != -1) {
                  __assert_fail("ret == -1",
                                "/workspace/llm4binary/github/license_c_cmakelists/Evgueni-Petrov-aka-espetrov[P]TestDriver/testDriver.c"
                                ,0x218,"int _LaunchLabExecutable(char *)");
                }
                pcVar12 = "execl";
              }
              ReportSystemError(pcVar12);
              exit(1);
            }
            memset(&local_158,0,0x90);
            if (UserTimeout < 0) {
              iVar3 = GetTestTimeout();
              uVar13 = (ulong)(iVar3 / 1000);
              iVar3 = UserTimeout;
              local_200.tv_sec = uVar13;
              if (UserTimeout < 0) {
                iVar3 = GetTestTimeout();
              }
            }
            else {
              uVar13 = (ulong)(uint)UserTimeout / 1000;
              iVar3 = UserTimeout;
              local_200.tv_sec = uVar13;
            }
            local_200.tv_nsec = (long)((iVar3 % 1000) * 1000000);
            if (0 < iVar3 % 1000 || 0 < (long)uVar13) {
              do {
                local_21c = 0;
                _Var5 = wait4(__pid,&local_21c,1,&local_158);
                if (_Var5 != 0) {
                  if (_Var5 == -1) {
LAB_00102d59:
                    pcVar12 = "wait4";
                    goto LAB_00102bc8;
                  }
                  if ((local_21c & 0x7f) == 0) {
                    if ((local_21c & 0xff00) == 0) {
                      uVar13 = (ulong)UserMemoryLimit;
                      if ((long)uVar13 < 0) {
                        uVar13 = GetTestMemoryLimit();
                      }
                      iVar3 = 0;
                      if ((ulong)(local_158.ru_maxrss << 10) <= uVar13) goto LAB_00102bd2;
                      iVar3 = UserMemoryLimit;
                      if (UserMemoryLimit < 0) {
                        sVar8 = GetTestMemoryLimit();
                        iVar3 = (int)sVar8;
                      }
                      PrintWithoutBuffering
                                ("\nExecutable file \"%s\" used %dKB > %dKB\n",pcVar12,
                                 (ulong)((uint)(local_158.ru_maxrss << 10) | 0x3e0) / 1000,
                                 (ulong)(iVar3 + 999) / 1000);
                      goto LAB_00102bcd;
                    }
                    pcVar11 = "\nExecutable file \"%s\" terminated with return code != 0\n";
                  }
                  else {
                    if ((int)((local_21c & 0x7f) * 0x1000000 + 0x1000000) < 0x2000000)
                    goto LAB_00102d59;
                    pcVar11 = "\nExecutable file \"%s\" terminated with exception\n";
                  }
                  PrintWithoutBuffering(pcVar11,pcVar12);
                  goto LAB_00102bcd;
                }
                iVar3 = nanosleep(&local_200,&local_200);
                if (iVar3 == 0) break;
                piVar7 = __errno_location();
                if (*piVar7 != 4) {
                  __assert_fail("errno == EINTR",
                                "/workspace/llm4binary/github/license_c_cmakelists/Evgueni-Petrov-aka-espetrov[P]TestDriver/testDriver.c"
                                ,0x1ee,
                                "int WaitForProcess(pid_t, struct timespec *, struct rusage *)");
                }
              } while ((0 < local_200.tv_sec) || (0 < local_200.tv_nsec));
            }
            iVar3 = UserTimeout;
            if (UserTimeout < 0) {
              iVar3 = GetTestTimeout();
            }
            PrintWithoutBuffering
                      ("\nExecutable file \"%s\" didn\'t terminate in %d seconds\n",pcVar12,
                       (ulong)(iVar3 + 999) / 1000);
            iVar6 = kill(__pid,9);
            iVar3 = 1;
            if (iVar6 != 0) {
              ReportSystemError("kill");
            }
          }
LAB_00102bd2:
          iVar6 = sigaction(0x11,&local_c8,(sigaction *)0x0);
          if (iVar6 == 0) {
            return iVar3;
          }
LAB_00102bee:
          ReportSystemError("sigaction");
          return -1;
        }
      }
    }
    else {
      pcVar12 = argv[1];
      if (*pcVar12 == '-') {
        if (((pcVar12[1] == 'm') && (pcVar12[2] == '\0')) && (iVar3 = atoi(argv[2]), iVar3 != 0)) {
          ppcVar10 = argv + 2;
          UserMemoryLimit = iVar3 << 10;
          argc = argc - 2;
          if ((uint)argc < 4) goto LAB_00102822;
          pcVar12 = argv[3];
          argv = ppcVar10;
          if (*pcVar12 != '-') goto LAB_00102921;
        }
        ppcVar10 = argv;
        if (((pcVar12[1] == 't') && (pcVar12[2] == '\0')) && (iVar3 = atoi(argv[2]), iVar3 != 0)) {
          argc = argc - 2;
          ppcVar10 = argv + 2;
          UserTimeout = iVar3;
          goto LAB_00102822;
        }
        goto LAB_00102839;
      }
    }
LAB_00102921:
    PrintWithoutBuffering("\nKOI FIT NSU Lab Tester (c) 2009-2020 by Evgueni Petrov\n");
  }
  pcVar12 = GetTesterName();
  PrintWithoutBuffering("\nTesting %s...\n",pcVar12);
  iVar3 = GetTestCount();
  uVar13 = 0;
  if (0 < iVar3) {
    uVar13 = 0;
    testIdx = 0;
    local_218 = argv;
    do {
      argv = local_218;
      uVar14 = testIdx + 1;
      uVar4 = GetTestCount();
      PrintWithoutBuffering("TEST %d/%d: ",(ulong)uVar14,(ulong)uVar4);
      TVar15 = GetLabTest(testIdx);
      iVar3 = (*TVar15.Feeder)();
      iVar6 = 0;
      if ((iVar3 != 0) && (iVar6 = -1, UserTestAll != '\x01')) break;
      pcVar12 = argv[1];
      sVar8 = (size_t)UserMemoryLimit;
      local_210 = uVar13;
      if ((long)sVar8 < 0) {
        sVar8 = GetTestMemoryLimit();
      }
      uVar4 = UserTimeout;
      if (UserTimeout < 0) {
        uVar4 = GetTestTimeout();
      }
      iVar3 = snprintf(GetRunnerCommand_runnerCommand,0x1000,"%s -m %zu -t %d -e %s",local_208,
                       sVar8 + 0x3ff >> 10,(ulong)uVar4,pcVar12);
      if (iVar3 < 0) {
        pcVar12 = "\nInternal error: snprintf returned negative value\n";
LAB_00102b24:
        PrintWithoutBuffering(pcVar12);
        uVar13 = local_210;
        argv = local_218;
        break;
      }
      if (iVar3 == 0xfff) {
        pcVar12 = "\nInternal error: snprintf stopped at the end of buffer\n";
        goto LAB_00102b24;
      }
      gettimeofday((timeval *)&local_1f0,(__timezone_ptr_t)0x0);
      uVar2 = local_1e8.__val[0];
      _Var1 = local_1f0;
      iVar3 = system(GetRunnerCommand_runnerCommand);
      uVar13 = local_210;
      argv = local_218;
      if (iVar3 != 0) break;
      gettimeofday((timeval *)&local_1f0,(__timezone_ptr_t)0x0);
      PrintWithoutBuffering
                ("%.0f ms, ",
                 (double)((_Var1._0_4_ * -1000 +
                           ((int)(SUB168(SEXT816((long)uVar2) * SEXT816(-0x20c49ba5e353f7cf),8) >> 7
                                 ) - (SUB164(SEXT816((long)uVar2) * SEXT816(-0x20c49ba5e353f7cf),0xc
                                            ) >> 0x1f)) +
                           ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) *
                                         SEXT816((long)local_1e8.__val[0]),8) >> 7) -
                           (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816((long)local_1e8.__val[0]),
                                   0xc) >> 0x1f)) + local_1f0._0_4_ * 1000 + 86400000) % 86400000));
      TVar15 = GetLabTest(testIdx);
      iVar3 = (*TVar15.Checker)();
      if ((iVar3 != 0) && (iVar6 = -1, uVar13 = local_210, argv = local_218, UserTestAll != '\x01'))
      break;
      uVar13 = (ulong)((int)local_210 + iVar6 + 1);
      iVar3 = GetTestCount();
      argv = local_218;
      testIdx = uVar14;
    } while ((int)uVar14 < iVar3);
  }
  iVar3 = GetTestCount();
  if (iVar3 <= (int)uVar13) {
    PrintWithoutBuffering
              ("\n:-)\n\nExecutable file %s passed all tests.\nPlease review the source code with your teaching assistant.\n"
               ,argv[1]);
    return 0;
  }
  pcVar11 = 
  "\n:-(\n\nExecutable file %s failed for input file in.txt in the current directory.\nPlease fix and try again.\n"
  ;
  pcVar12 = argv[1];
LAB_00102b49:
  PrintWithoutBuffering(pcVar11,pcVar12);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
    int i, count, fail;
    const char* runnerExe = argv[0];

    if (argc >= 3 && strcmp(argv[1], "-a") == 0) {
        UserTestAll = 1;
        argv++;
        argc--;
    }
    if (argc >= 4 && strcmp(argv[1], "-m") == 0 && atoi(argv[2]) != 0) {
        UserMemoryLimit = atoi(argv[2])*1024;
        argv += 2;
        argc -= 2;
    }
    if (argc >= 4 && strcmp(argv[1], "-t") == 0 && atoi(argv[2]) != 0) {
        UserTimeout = atoi(argv[2]);
        argv += 2;
        argc -= 2;
    }
    if (argc >= 3 && strcmp(argv[1], "-e") == 0) {
        return LaunchLabExecutable(argv[2]);
    }

    PrintWithoutBuffering("\nKOI FIT NSU Lab Tester (c) 2009-2020 by Evgueni Petrov\n");

    if (argc < 2) {
        PrintWithoutBuffering("\nTo test mylab.exe, do %s mylab.exe\n", runnerExe);
        return 1;
    }

    PrintWithoutBuffering("\nTesting %s...\n", GetTesterName());

    for (i = 0, count = 0, fail = 0; i < GetTestCount(); i++, fail = 0) {
        PrintWithoutBuffering("TEST %d/%d: ", i+1, GetTestCount());
        if (GetLabTest(i).Feeder() != 0) {
            if (!UserTestAll) {
                break;
            }
            fail = 1;
        }
        const char* runnerCommand = GetRunnerCommand(runnerExe, argv[1]);
        if (!runnerCommand) {
            break;
        }
        double ms0 = GetTickCount();
        if (system(runnerCommand) != 0) {
            break;
        }
        double ms1 = GetTickCount();
        int millisecondsPerDay = 1000 * 60 * 60 * 24;
        double msElapsed = ((int)(ms1 - ms0) + millisecondsPerDay) % millisecondsPerDay;
        PrintWithoutBuffering("%.0f ms, ", msElapsed);
        if (GetLabTest(i).Checker() != 0) {
            if (!UserTestAll) {
                break;
            }
            fail = 1;
        }
        count += 1 - fail;
    }

    if (count < GetTestCount()) {
        PrintWithoutBuffering("\n:-(\n\n"
        "Executable file %s failed for input file in.txt in the current directory.\n"
        "Please fix and try again.\n", argv[1]);
        return 1;
    } else {
        PrintWithoutBuffering("\n:-)\n\n"
        "Executable file %s passed all tests.\n"
        "Please review the source code with your teaching assistant.\n", argv[1]);
        return 0;
    }
}